

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall xemmai::t_emit::f_merge(t_emit *this,t_block *a_junction)

{
  bool bVar1;
  pointer ptVar2;
  ulong *puVar3;
  ulong uVar4;
  size_t i;
  ulong __n;
  reference rVar5;
  
  for (__n = 0; ptVar2 = (a_junction->v_privates).
                         super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                         ._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)((long)(a_junction->v_privates).
                          super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2 >> 2);
      __n = __n + 1) {
    bVar1 = ptVar2[__n].v_out;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this->v_privates,__n);
    puVar3 = rVar5._M_p;
    if (bVar1 == true) {
      uVar4 = rVar5._M_mask | *puVar3;
    }
    else {
      uVar4 = ~rVar5._M_mask & *puVar3;
    }
    *puVar3 = uVar4;
  }
  return;
}

Assistant:

void f_merge(const ast::t_block& a_junction)
	{
		for (size_t i = 0; i < a_junction.v_privates.size(); ++i) (*v_privates)[i] = a_junction.v_privates[i].v_out;
	}